

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O3

int mbedtls_aes_crypt_xts
              (mbedtls_aes_xts_context *ctx,int mode,size_t length,uchar *data_unit,uchar *input,
              uchar *output)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  uchar tmp [16];
  uchar tweak [16];
  uchar prev_tweak [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  mbedtls_aes_xts_context *local_60;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48 [6];
  
  iVar3 = -0x22;
  if ((0xffffffffff00000e < length - 0x1000001) &&
     (iVar3 = mbedtls_aes_crypt_ecb(&ctx->tweak,1,data_unit,(uchar *)&local_58), iVar3 == 0)) {
    uVar8 = (uint)length & 0xf;
    uVar9 = (ulong)uVar8;
    uVar6 = length >> 4;
    local_60 = ctx;
    do {
      puVar7 = (uint *)output;
      uVar6 = uVar6 - 1;
      if (uVar6 == 0 && (mode == 0 && uVar9 != 0)) {
        mbedtls_gf128mul_x_ble((uchar *)&local_58,(uchar *)&local_58);
      }
      local_78 = *(uint *)input ^ local_58;
      uStack_74 = *(uint *)((long)input + 4) ^ uStack_54;
      uStack_70 = *(uint *)((long)input + 8) ^ uStack_50;
      uStack_6c = *(uint *)((long)input + 0xc) ^ uStack_4c;
      iVar3 = mbedtls_aes_crypt_ecb(&local_60->crypt,mode,(uchar *)&local_78,(uchar *)&local_78);
      if (iVar3 != 0) {
        return iVar3;
      }
      *puVar7 = local_58 ^ local_78;
      puVar7[1] = uStack_54 ^ uStack_74;
      puVar7[2] = uStack_50 ^ uStack_70;
      puVar7[3] = uStack_4c ^ uStack_6c;
      mbedtls_gf128mul_x_ble((uchar *)&local_58,(uchar *)&local_58);
      input = (uchar *)((long)input + 0x10);
      output = (uchar *)(puVar7 + 4);
    } while (uVar6 != 0);
    if (uVar9 != 0) {
      puVar10 = &local_58;
      if (mode == 0) {
        puVar10 = local_48;
      }
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        *(uchar *)((long)(puVar7 + 4) + uVar5) = *(uchar *)((long)puVar7 + uVar5);
        *(byte *)((long)&local_78 + uVar5) =
             *(byte *)((long)puVar10 + uVar5) ^ *(byte *)((long)input + uVar5);
        uVar6 = uVar5 + 1;
      } while (uVar9 != uVar6);
      if (uVar5 < 0xf) {
        lVar4 = (uVar6 - uVar8 * 2) + 0x10;
        do {
          *(byte *)((long)&local_78 + uVar9) =
               *(byte *)((long)puVar10 + uVar9) ^ *(byte *)((long)puVar7 + uVar9);
          uVar9 = uVar9 + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      iVar3 = mbedtls_aes_crypt_ecb(&local_60->crypt,mode,(uchar *)&local_78,(uchar *)&local_78);
      if (iVar3 != 0) {
        return iVar3;
      }
      uVar8 = puVar10[1];
      uVar1 = puVar10[2];
      uVar2 = puVar10[3];
      *puVar7 = *puVar10 ^ local_78;
      puVar7[1] = uVar8 ^ uStack_74;
      puVar7[2] = uVar1 ^ uStack_70;
      puVar7[3] = uVar2 ^ uStack_6c;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_aes_crypt_xts( mbedtls_aes_xts_context *ctx,
                           int mode,
                           size_t length,
                           const unsigned char data_unit[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t blocks = length / 16;
    size_t leftover = length % 16;
    unsigned char tweak[16];
    unsigned char prev_tweak[16];
    unsigned char tmp[16];

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( mode == MBEDTLS_AES_ENCRYPT ||
                      mode == MBEDTLS_AES_DECRYPT );
    AES_VALIDATE_RET( data_unit != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    /* Data units must be at least 16 bytes long. */
    if( length < 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* NIST SP 800-38E disallows data units larger than 2**20 blocks. */
    if( length > ( 1 << 20 ) * 16 )
        return MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH;

    /* Compute the tweak. */
    ret = mbedtls_aes_crypt_ecb( &ctx->tweak, MBEDTLS_AES_ENCRYPT,
                                 data_unit, tweak );
    if( ret != 0 )
        return( ret );

    while( blocks-- )
    {
        size_t i;

        if( leftover && ( mode == MBEDTLS_AES_DECRYPT ) && blocks == 0 )
        {
            /* We are on the last block in a decrypt operation that has
             * leftover bytes, so we need to use the next tweak for this block,
             * and this tweak for the lefover bytes. Save the current tweak for
             * the leftovers and then update the current tweak for use on this,
             * the last full block. */
            memcpy( prev_tweak, tweak, sizeof( tweak ) );
            mbedtls_gf128mul_x_ble( tweak, tweak );
        }

        for( i = 0; i < 16; i++ )
            tmp[i] = input[i] ^ tweak[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return( ret );

        for( i = 0; i < 16; i++ )
            output[i] = tmp[i] ^ tweak[i];

        /* Update the tweak for the next block. */
        mbedtls_gf128mul_x_ble( tweak, tweak );

        output += 16;
        input += 16;
    }

    if( leftover )
    {
        /* If we are on the leftover bytes in a decrypt operation, we need to
         * use the previous tweak for these bytes (as saved in prev_tweak). */
        unsigned char *t = mode == MBEDTLS_AES_DECRYPT ? prev_tweak : tweak;

        /* We are now on the final part of the data unit, which doesn't divide
         * evenly by 16. It's time for ciphertext stealing. */
        size_t i;
        unsigned char *prev_output = output - 16;

        /* Copy ciphertext bytes from the previous block to our output for each
         * byte of cyphertext we won't steal. At the same time, copy the
         * remainder of the input for this final round (since the loop bounds
         * are the same). */
        for( i = 0; i < leftover; i++ )
        {
            output[i] = prev_output[i];
            tmp[i] = input[i] ^ t[i];
        }

        /* Copy ciphertext bytes from the previous block for input in this
         * round. */
        for( ; i < 16; i++ )
            tmp[i] = prev_output[i] ^ t[i];

        ret = mbedtls_aes_crypt_ecb( &ctx->crypt, mode, tmp, tmp );
        if( ret != 0 )
            return ret;

        /* Write the result back to the previous block, overriding the previous
         * output we copied. */
        for( i = 0; i < 16; i++ )
            prev_output[i] = tmp[i] ^ t[i];
    }

    return( 0 );
}